

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

SIMDExtract * __thiscall
wasm::Builder::makeSIMDExtract(Builder *this,SIMDExtractOp op,Expression *vec,uint8_t index)

{
  SIMDExtract *this_00;
  
  this_00 = MixedArena::alloc<wasm::SIMDExtract>(&this->wasm->allocator);
  this_00->op = op;
  this_00->vec = vec;
  this_00->index = index;
  SIMDExtract::finalize(this_00);
  return this_00;
}

Assistant:

SIMDExtract*
  makeSIMDExtract(SIMDExtractOp op, Expression* vec, uint8_t index) {
    auto* ret = wasm.allocator.alloc<SIMDExtract>();
    ret->op = op;
    ret->vec = vec;
    ret->index = index;
    ret->finalize();
    return ret;
  }